

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O3

vector<kratos::EventInfo,_std::allocator<kratos::EventInfo>_> *
kratos::extract_event_info
          (vector<kratos::EventInfo,_std::allocator<kratos::EventInfo>_> *__return_storage_ptr__,
          Generator *top)

{
  __node_base_ptr *__x;
  undefined1 local_88 [8];
  EventVisitor visitor;
  
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_88 = (undefined1  [8])&PTR_visit_root_002ac068;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  visitor.info.super__Vector_base<kratos::EventInfo,_std::allocator<kratos::EventInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  visitor.info.super__Vector_base<kratos::EventInfo,_std::allocator<kratos::EventInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  IRVisitor::visit_root((IRVisitor *)local_88,&top->super_IRNode);
  __x = &visitor.super_IRVisitor.visited_._M_h._M_single_bucket;
  std::vector<kratos::EventInfo,_std::allocator<kratos::EventInfo>_>::vector
            (__return_storage_ptr__,
             (vector<kratos::EventInfo,_std::allocator<kratos::EventInfo>_> *)__x);
  local_88 = (undefined1  [8])&PTR_visit_root_002ac068;
  std::vector<kratos::EventInfo,_std::allocator<kratos::EventInfo>_>::~vector
            ((vector<kratos::EventInfo,_std::allocator<kratos::EventInfo>_> *)__x);
  local_88 = (undefined1  [8])&PTR_visit_root_002a8ae0;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return __return_storage_ptr__;
}

Assistant:

std::vector<EventInfo> extract_event_info(Generator *top) {
    EventVisitor visitor;
    visitor.visit_root(top);
    return visitor.info;
}